

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::SocketNetwork::parseAddress(SocketNetwork *this,StringPtr addr,uint portHint)

{
  PromiseArena *pPVar1;
  RemoveConst<kj::(anonymous_namespace)::SocketAddress> *pRVar2;
  SocketAddress *pSVar3;
  OwnPromiseNode OVar4;
  Fault FVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  void *pvVar11;
  Exception *pEVar12;
  void *pvVar13;
  int *piVar14;
  undefined4 in_register_0000000c;
  long *__s;
  TransformPromiseNodeBase *this_00;
  SocketNetwork *__nptr;
  NetworkFilter *in_R8;
  NetworkFilter *filter;
  char *pcVar15;
  SocketAddress *pSVar16;
  Exception *e;
  ulong uVar17;
  char *pcVar18;
  NetworkFilter *this_01;
  bool bVar19;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  OwnPromiseNode local_618;
  int af;
  Fault f;
  size_t sStack_600;
  ArrayDisposer *local_5f8;
  ArrayPtr<const_char> local_5e8;
  LowLevelAsyncIoProvider local_5d0;
  unsigned_long port;
  uint local_5bc;
  NetworkFilter *local_5b8;
  PromiseArena *local_5b0;
  StringPtr local_5a8;
  char *endptr;
  ArrayDisposer *pAStack_590;
  ArrayDisposer *local_588;
  uint local_580;
  undefined1 local_57c;
  sockaddr local_578 [8];
  Fault f_5;
  NullableValue<kj::Exception> _e1576;
  
  pcVar15 = (char *)CONCAT44(in_register_0000000c,portHint);
  __s = (long *)addr.content.size_;
  local_5b0 = (PromiseArena *)addr.content.ptr;
  uVar17 = (ulong)in_R8 & 0xffffffff;
  local_618.ptr = (PromiseNode *)0x0;
  this_01 = (NetworkFilter *)(local_5b0->bytes + 0x10);
  filter = in_R8;
  local_5a8.content.ptr = (char *)__s;
  local_5a8.content.size_ = (size_t)pcVar15;
  memset(&local_580,0,0x88);
  pcVar18 = pcVar15 + -1;
  if ((&DAT_00000004 < pcVar18) && (*(char *)((long)__s + 4) == ':' && (int)*__s == 0x78696e75)) {
    pSVar16 = (SocketAddress *)(pcVar15 + -6);
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x6c;
    array.endPtr = (SocketAddress *)anon_var_dwarf_393616;
    array.disposer = (ArrayDisposer *)&DAT_00000004;
    array.ptr = pSVar16;
    if ((SocketAddress *)0x6b < pSVar16) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3ef,FAILED,"path.size() < sizeof(addr.unixDomain.sun_path)",
                 "_kjCondition,\"Unix domain socket address is too long.\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&array,
                 (char (*) [40])"Unix domain socket address is too long.",&local_5a8);
      kj::_::Debug::Fault::fatal(&f);
    }
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)
                strlen((char *)((long)__s + 5));
    array.endPtr = (SocketAddress *)anon_var_dwarf_3a16;
    array.disposer = (ArrayDisposer *)&DAT_00000005;
    if (pSVar16 != array.pos) {
      array.ptr = pSVar16;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[91]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3f2,FAILED,"path.size() == strlen(path.cStr())",
                 "_kjCondition,\"Unix domain socket address contains NULL. Use\" \" \'unix-abstract:\' for the abstract namespace.\""
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)&array,
                 (char (*) [91])
                 "Unix domain socket address contains NULL. Use \'unix-abstract:\' for the abstract namespace."
                );
      kj::_::Debug::Fault::fatal(&f);
    }
    local_578[0].sa_family = 1;
    array.ptr = pSVar16;
    strcpy(local_578[0].sa_data,(char *)((long)__s + 5));
    local_580 = (int)pSVar16 + 3;
    bVar19 = kj::_::NetworkFilter::shouldAllowParse(this_01,local_578,local_580);
    if (!bVar19) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                ((Fault *)&array,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x3f8,FAILED,(char *)0x0,"\"unix sockets blocked by restrictPeers()\"",
                 (char (*) [40])0x5bed5e);
      kj::_::Debug::Fault::fatal((Fault *)&array);
    }
    pEVar12 = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    array.endPtr = (SocketAddress *)(pEVar12->trace + 4);
    array.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    array.ptr = (SocketAddress *)pEVar12;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)pEVar12;
    memcpy(pEVar12,&local_580,0x88);
    array.ptr = (SocketAddress *)0x0;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    array.endPtr = (SocketAddress *)0x0;
    f.exception = pEVar12;
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5d0,
               (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f);
    FVar5.exception = f.exception;
    if (f.exception != (Exception *)0x0) {
      f.exception = (Exception *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,FVar5.exception,0x88,1,1,
                 (_func_void_void_ptr *)0x0);
    }
    pSVar3 = array.endPtr;
    pRVar2 = array.pos;
    pSVar16 = array.ptr;
    if (array.ptr != (SocketAddress *)0x0) {
      array.ptr = (SocketAddress *)0x0;
      array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
      array.endPtr = (SocketAddress *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pSVar16,0x88,
                 ((long)pRVar2 - (long)pSVar16 >> 3) * -0xf0f0f0f0f0f0f0f,
                 ((long)pSVar3 - (long)pSVar16 >> 3) * -0xf0f0f0f0f0f0f0f,(_func_void_void_ptr *)0x0
                );
    }
    goto LAB_004ad422;
  }
  if ((&DAT_0000000d < pcVar18) &&
     (*(long *)((long)__s + 6) == 0x3a74636172747362 && *__s == 0x7362612d78696e75)) {
    array.ptr = (SocketAddress *)(pcVar15 + -0xe);
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x6c;
    array.endPtr = (SocketAddress *)anon_var_dwarf_393616;
    array.disposer = (ArrayDisposer *)&DAT_00000004;
    if ((SocketAddress *)0x6b < array.ptr) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[40],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x404,FAILED,"path.size() + 1 < sizeof(addr.unixDomain.sun_path)",
                 "_kjCondition,\"Unix domain socket address is too long.\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&array,
                 (char (*) [40])"Unix domain socket address is too long.",&local_5a8);
      kj::_::Debug::Fault::fatal(&f);
    }
    local_578[0].sa_family = 1;
    local_578[0].sa_data._0_2_ = local_578[0].sa_data._0_2_ & 0xff00;
    memcpy(local_578[0].sa_data + 1,(char *)((long)__s + 0xe),(size_t)array.ptr);
    local_580 = portHint - 0xc;
    bVar19 = kj::_::NetworkFilter::shouldAllowParse(this_01,local_578,local_580);
    if (!bVar19) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                ((Fault *)&array,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x40d,FAILED,(char *)0x0,"\"abstract unix sockets blocked by restrictPeers()\"",
                 (char (*) [49])"abstract unix sockets blocked by restrictPeers()");
      kj::_::Debug::Fault::fatal((Fault *)&array);
    }
    pEVar12 = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    array.endPtr = (SocketAddress *)(pEVar12->trace + 4);
    array.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    array.ptr = (SocketAddress *)pEVar12;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)pEVar12;
    memcpy(pEVar12,&local_580,0x88);
    array.ptr = (SocketAddress *)0x0;
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    array.endPtr = (SocketAddress *)0x0;
    f.exception = pEVar12;
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5d0,
               (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f);
    FVar5.exception = f.exception;
    if (f.exception != (Exception *)0x0) {
      f.exception = (Exception *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,FVar5.exception,0x88,1,1,
                 (_func_void_void_ptr *)0x0);
    }
    pSVar3 = array.endPtr;
    pRVar2 = array.pos;
    pSVar16 = array.ptr;
    if (array.ptr != (SocketAddress *)0x0) {
      array.ptr = (SocketAddress *)0x0;
      array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
      array.endPtr = (SocketAddress *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pSVar16,0x88,
                 ((long)pRVar2 - (long)pSVar16 >> 3) * -0xf0f0f0f0f0f0f0f,
                 ((long)pSVar3 - (long)pSVar16 >> 3) * -0xf0f0f0f0f0f0f0f,(_func_void_void_ptr *)0x0
                );
    }
    goto LAB_004ad422;
  }
  local_5e8.ptr = (char *)0x0;
  local_5e8.size_ = 0;
  if ((pcVar18 == (char *)0x0) || ((char)*__s != '[')) {
    pvVar13 = memchr(__s,0x3a,(size_t)pcVar18);
    if (pvVar13 == (void *)0x0) {
      af = 2;
      local_5e8.ptr = (char *)__s;
      local_5e8.size_ = (size_t)pcVar18;
      goto LAB_004acdba;
    }
    local_5bc = (uint)in_R8;
    __nptr = (SocketNetwork *)((long)pvVar13 + 1);
    uVar17 = ~(ulong)((long)pvVar13 - (long)__s);
    local_5b8 = this_01;
    pvVar11 = memchr(__nptr,0x3a,(size_t)(pcVar15 + (uVar17 - 1)));
    bVar19 = pvVar11 == (void *)0x0;
    if (bVar19) {
      pcVar15 = pcVar15 + uVar17;
      af = 2;
      local_5e8.size_ = (size_t)((long)pvVar13 - (long)__s);
    }
    else {
      af = 10;
      local_5e8.size_ = (size_t)pcVar18;
    }
    uVar17 = (ulong)local_5bc;
    this_01 = local_5b8;
    local_5e8.ptr = (char *)__s;
  }
  else {
    af = 10;
    pcVar10 = pcVar18;
    do {
      pcVar9 = pcVar10;
      pcVar10 = pcVar9 + -1;
      if (pcVar9 == (char *)0x0) break;
    } while (((char *)((long)__s + -1))[(long)pcVar9] != ']');
    if (pcVar9 == (char *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::StringPtr&>
                (&f_5,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x422,FAILED,"str.findLast(\']\') != nullptr",
                 "\"Unclosed \'[\' in address string.\", str",
                 (char (*) [32])"Unclosed \'[\' in address string.",&local_5a8);
      kj::_::Debug::Fault::fatal(&f_5);
    }
    local_5e8.ptr = (char *)((long)__s + 1);
    local_5e8.size_ = (size_t)(pcVar9 + -2);
    if (pcVar9 < pcVar18) {
      if ((long)pcVar15 - (long)pcVar10 == 2) {
        array.ptr = (SocketAddress *)((ulong)array.ptr._1_7_ << 8);
LAB_004ad88e:
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32],kj::StringPtr&>
                  (&f_5,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x427,FAILED,"str.slice(closeBracket + 1).startsWith(\":\")",
                   "_kjCondition,\"Expected port suffix after \']\'.\", str",
                   (DebugExpression<bool> *)&array,
                   (char (*) [32])"Expected port suffix after \']\'.",&local_5a8);
        kj::_::Debug::Fault::fatal(&f_5);
      }
      bVar19 = *(char *)((long)__s + (long)pcVar9) == ':';
      array.ptr = (SocketAddress *)CONCAT71(array.ptr._1_7_,bVar19);
      if (!bVar19) goto LAB_004ad88e;
      pcVar15 = pcVar15 + -(long)(pcVar9 + 1);
      bVar19 = true;
      __nptr = (SocketNetwork *)(pcVar10 + (long)__s + 2);
    }
    else {
LAB_004acdba:
      bVar19 = false;
      __nptr = this;
    }
  }
  port = uVar17;
  if (bVar19) {
    port = strtoul((char *)__nptr,&endptr,0);
    if ((pcVar15 == (char *)0x1) || (*endptr != '\0')) {
      heapString((String *)&array,local_5e8.ptr,local_5e8.size_);
      heapString((String *)&f,(char *)__nptr,(size_t)(pcVar15 + -1));
      SocketAddress::lookupHost(&local_5d0,(String *)&array,(String *)&f,(uint)uVar17,filter);
      FVar5 = f;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        (**local_5f8->_vptr_ArrayDisposer)(local_5f8,FVar5.exception,1,sStack_600,sStack_600,0);
      }
      pRVar2 = array.pos;
      pSVar16 = array.ptr;
      if (array.ptr != (SocketAddress *)0x0) {
        array.ptr = (SocketAddress *)0x0;
        array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
        (*(code *)**(undefined8 **)array.endPtr)(array.endPtr,pSVar16,1,pRVar2,pRVar2,0);
      }
      goto LAB_004ad422;
    }
    f_5.exception = (Exception *)&port;
    if (0xffff < port) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[23]>
                ((Fault *)&array,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x448,FAILED,"port < 65536","_kjCondition,\"Port number too large.\"",
                 (DebugComparison<unsigned_long_&,_int> *)&f_5,
                 (char (*) [23])"Port number too large.");
      kj::_::Debug::Fault::fatal((Fault *)&array);
    }
  }
  sVar6 = local_5e8.size_;
  iVar8 = af;
  if (((char *)local_5e8.size_ == (char *)0x1) && (*local_5e8.ptr == '*')) {
    local_57c = 1;
    local_580 = 0x1c;
    local_578[0].sa_family = 10;
    local_578[0].sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
    pEVar12 = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    f_5.exception = pEVar12;
    memcpy(pEVar12,&local_580,0x88);
    array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x1;
    array.endPtr = (SocketAddress *)&kj::_::HeapArrayDisposer::instance;
    f_5.exception = (Exception *)0x0;
    array.ptr = (SocketAddress *)pEVar12;
    Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
              ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5d0,
               (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&array);
    pRVar2 = array.pos;
    pSVar16 = array.ptr;
    if (array.ptr != (SocketAddress *)0x0) {
      array.ptr = (SocketAddress *)0x0;
      array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
      (*(code *)**(undefined8 **)array.endPtr)(array.endPtr,pSVar16,0x88,pRVar2,pRVar2);
    }
    FVar5.exception = f_5.exception;
    if (f_5.exception != (Exception *)0x0) {
      f_5.exception = (Exception *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,FVar5.exception,0x88,
                 (-(long)FVar5.exception >> 3) * -0xf0f0f0f0f0f0f0f,
                 (-(long)FVar5.exception >> 3) * -0xf0f0f0f0f0f0f0f,(_func_void_void_ptr *)0x0);
    }
  }
  else {
    pcVar18 = local_578[0].sa_data + 2;
    local_580 = 0x10;
    if (af == 10) {
      pcVar18 = local_578[0].sa_data + 6;
      local_580 = 0x1c;
    }
    local_578[0].sa_family = (ushort)(af == 10) * 8 + 2;
    local_578[0].sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
    if (local_5e8.size_ < (char *)0x2d) {
      f_5.exception = (Exception *)0x0;
      memcpy(&f_5,local_5e8.ptr,local_5e8.size_);
      *(char *)(sVar6 + (long)&f_5.exception) = '\0';
      iVar8 = inet_pton(iVar8,(char *)&f_5,pcVar18);
      if (iVar8 != 0) {
        if (iVar8 != 1) {
          piVar14 = __errno_location();
          kj::_::Debug::Fault::Fault<int,int&,kj::ArrayPtr<char_const>&>
                    ((Fault *)&array,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x486,*piVar14,"inet_pton","af, addrPart",&af,&local_5e8);
          kj::_::Debug::Fault::fatal((Fault *)&array);
        }
        bVar19 = kj::_::NetworkFilter::shouldAllowParse(this_01,local_578,local_580);
        if (!bVar19) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                    ((Fault *)&array,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x47a,FAILED,(char *)0x0,"\"address family blocked by restrictPeers()\"",
                     (char (*) [42])"address family blocked by restrictPeers()");
          kj::_::Debug::Fault::fatal((Fault *)&array);
        }
        filter = (NetworkFilter *)0x0;
        pEVar12 = (Exception *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0x88,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        array.endPtr = (SocketAddress *)(pEVar12->trace + 4);
        array.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        array.ptr = (SocketAddress *)pEVar12;
        array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)pEVar12;
        memcpy(pEVar12,&local_580,0x88);
        array.ptr = (SocketAddress *)0x0;
        array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
        array.endPtr = (SocketAddress *)0x0;
        f.exception = pEVar12;
        Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::Promise
                  ((Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&local_5d0,
                   (FixVoid<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)&f);
        FVar5.exception = f.exception;
        if (f.exception != (Exception *)0x0) {
          filter = (NetworkFilter *)0x1;
          f.exception = (Exception *)0x0;
          kj::_::HeapArrayDisposer::disposeImpl
                    ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,FVar5.exception,0x88,1
                     ,1,(_func_void_void_ptr *)0x0);
        }
        pSVar3 = array.endPtr;
        pRVar2 = array.pos;
        pSVar16 = array.ptr;
        if (array.ptr != (SocketAddress *)0x0) {
          array.ptr = (SocketAddress *)0x0;
          array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
          array.endPtr = (SocketAddress *)0x0;
          filter = (NetworkFilter *)(((long)pSVar3 - (long)pSVar16 >> 3) * -0xf0f0f0f0f0f0f0f);
          kj::_::HeapArrayDisposer::disposeImpl
                    ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pSVar16,0x88,
                     ((long)pRVar2 - (long)pSVar16 >> 3) * -0xf0f0f0f0f0f0f0f,(size_t)filter,
                     (_func_void_void_ptr *)0x0);
        }
      }
      if (iVar8 != 0) goto LAB_004ad422;
    }
    heapString((String *)&array,local_5e8.ptr,local_5e8.size_);
    endptr = (char *)0x0;
    pAStack_590 = (ArrayDisposer *)0x0;
    local_588 = (ArrayDisposer *)0x0;
    SocketAddress::lookupHost(&local_5d0,(String *)&array,(String *)&endptr,(uint)port,filter);
    pAVar7 = pAStack_590;
    pcVar18 = endptr;
    if (endptr != (char *)0x0) {
      endptr = (char *)0x0;
      pAStack_590 = (ArrayDisposer *)0x0;
      (**local_588->_vptr_ArrayDisposer)(local_588,pcVar18,1,pAVar7,pAVar7,0);
    }
    pRVar2 = array.pos;
    pSVar16 = array.ptr;
    if (array.ptr != (SocketAddress *)0x0) {
      array.ptr = (SocketAddress *)0x0;
      array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
      (*(code *)**(undefined8 **)array.endPtr)(array.endPtr,pSVar16,1,pRVar2,pRVar2,0);
    }
  }
LAB_004ad422:
  OVar4.ptr = local_618.ptr;
  local_618.ptr = (PromiseNode *)local_5d0._vptr_LowLevelAsyncIoProvider;
  local_5d0._vptr_LowLevelAsyncIoProvider = (_func_int **)0x0;
  if (&(OVar4.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
  }
  OVar4.ptr = local_618.ptr;
  pPVar1 = ((local_618.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_618.ptr - (long)pPVar1) < 0x28) {
    pvVar13 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar13 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_618,
               kj::_::
               SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1741:13)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar13 + 0x3d8) = &PTR_destroy_0070dae0;
    *(PromiseArena **)((long)pvVar13 + 0x3f8) = local_5b0;
    *(void **)((long)pvVar13 + 0x3e0) = pvVar13;
  }
  else {
    ((local_618.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_618.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_618,
               kj::_::
               SimpleTransformPromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1741:13)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    OVar4.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0070dae0;
    OVar4.ptr[-1].super_PromiseArenaMember.arena = local_5b0;
    OVar4.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar4.ptr = local_618.ptr;
  (this->super_Network)._vptr_Network = (_func_int **)this_00;
  if (&(local_618.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_618.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar4.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    return evalNow([&]() {
      return SocketAddress::parse(lowLevel, addr, portHint, filter);
    }).then([this](Array<SocketAddress> addresses) -> Own<NetworkAddress> {
      return heap<NetworkAddressImpl>(lowLevel, filter, kj::mv(addresses));
    });
  }